

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O2

void __thiscall CNscContext::AddStream(CNscContext *this,CNwnStream *pStream)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  Entry *pEVar4;
  char *pcVar5;
  undefined4 extraout_var;
  size_t sVar6;
  char *__dest;
  undefined8 uStack_80;
  char acStack_78 [8];
  undefined1 local_70 [8];
  File sFile;
  
  uStack_80 = 0x14e97d;
  pEVar4 = (Entry *)operator_new(0x38);
  pEVar4->pNext = this->m_pStreamTop;
  pEVar4->pStream = pStream;
  uStack_80 = 0x14e995;
  pcVar5 = (char *)operator_new__(0x9000);
  pEVar4->pszLine = pcVar5;
  pEVar4->pszToken = pcVar5 + 0x8000;
  pEVar4->pszNextTokenPos = (char *)0x0;
  pEVar4->pszNextUnreplacedTokenPos = (char *)0x0;
  pEVar4->nLine = 0;
  pEVar4->nFile = -1;
  this->m_pStreamTop = pEVar4;
  this->m_nStreamDepth = this->m_nStreamDepth + 1;
  uStack_80 = 0x14e9c9;
  iVar3 = (*pStream->_vptr_CNwnStream[0xd])(pStream);
  if ((char *)CONCAT44(extraout_var,iVar3) != (char *)0x0) {
    pEVar4->nFile =
         (int)(((long)(this->m_asFiles).
                      super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_asFiles).
                     super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x48);
    uStack_80 = 0x14e9f7;
    pcVar5 = NwnBasename((char *)CONCAT44(extraout_var,iVar3));
    uStack_80 = 0x14ea02;
    sVar6 = strlen(pcVar5);
    lVar2 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
    __dest = acStack_78 + lVar2;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14ea1e;
    strcpy(__dest,pcVar5);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x2e;
    uVar1 = *(undefined8 *)((long)&uStack_80 + lVar2);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14ea29;
    pcVar5 = strrchr(__dest,(int)uVar1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
    }
    if ((this->m_asFiles).super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->m_asFiles).super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14ea49;
      strlwr(__dest);
    }
    local_70 = (undefined1  [8])&sFile.strName._M_string_length;
    sFile.strName._M_dataplus._M_p = (pointer)0x0;
    sFile.strName._M_string_length._0_1_ = 0;
    sFile.strName.field_2._8_8_ = &sFile.strFullName._M_string_length;
    sFile.strFullName._M_dataplus._M_p = (pointer)0x0;
    sFile.strFullName._M_string_length._0_1_ = 0;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14ea75;
    std::__cxx11::string::assign(local_70);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14ea81;
    std::__cxx11::string::assign(sFile.strName.field_2._M_local_buf + 8);
    sFile.strFullName.field_2._8_8_ = 0xffffffffffffffff;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14ea99;
    std::vector<CNscContext::File,_std::allocator<CNscContext::File>_>::push_back
              (&this->m_asFiles,(value_type *)local_70);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x14eaa2;
    File::~File((File *)local_70);
  }
  return;
}

Assistant:

void AddStream (CNwnStream *pStream)
	{

		//
		// Add a new entry to the list
		//

		Entry *pEntry = new Entry;
		pEntry ->pNext = m_pStreamTop;
		pEntry ->pStream = pStream;
		pEntry ->pszLine = new char [Max_Line_Length + Max_Token_Length];
		pEntry ->pszToken = &pEntry ->pszLine [Max_Line_Length];
		pEntry ->pszNextTokenPos = NULL;
		pEntry ->pszNextUnreplacedTokenPos = NULL;
		pEntry ->nLine = 0;
		pEntry ->nFile = -1;
		m_pStreamTop = pEntry;
		m_nStreamDepth++;

		//
		// Add the file name to the list of files
		//

		const char *pszFileName = pStream ->GetFileName ();
		if (pszFileName)
		{
			pEntry ->nFile = (int) m_asFiles .size ();
			const char *pszBaseName = NwnBasename (pszFileName);
			size_t nLength = strlen (pszBaseName);
			char *pszCopy = (char *) alloca (nLength + 1);
			strcpy (pszCopy, pszBaseName);
			char *pszExt = strrchr (pszCopy, '.');
			if (pszExt)
				*pszExt = 0;
			// In the NDB file, the main is lowercase...
			if (m_asFiles .size () == 0)
				strlwr (pszCopy);
			File sFile;
			sFile .strName = pszCopy;
			sFile .strFullName = pszFileName;
			sFile .nOutputIndex = -1;
			sFile .nFileIndex = -1;
			m_asFiles .push_back (sFile);
		}
		return;
	}